

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::Unparser::unparseParams
          (Unparser *this,Fodder *fodder_l,ArgParams *params,bool trailing_comma,Fodder *fodder_r)

{
  bool bVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  ArgParam *param;
  const_iterator __end2;
  const_iterator __begin2;
  ArgParams *__range2;
  bool first;
  undefined1 in_stack_00000597;
  AST *in_stack_00000598;
  Unparser *in_stack_000005a0;
  ostream *in_stack_ffffffffffffff68;
  Unparser *in_stack_ffffffffffffff70;
  Unparser local_70;
  reference local_50;
  ArgParam *local_48;
  __normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_40;
  undefined8 local_38;
  byte local_29;
  byte local_19;
  undefined8 local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  fill(in_stack_ffffffffffffff70,(Fodder *)in_stack_ffffffffffffff68,false,false);
  std::operator<<((ostream *)*in_RDI,"(");
  local_29 = 1;
  local_38 = local_18;
  local_40._M_current =
       (ArgParam *)
       std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::begin
                 ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_ffffffffffffff68);
  local_48 = (ArgParam *)
             std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
             ::end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
               ::operator*(&local_40);
    if ((local_29 & 1) == 0) {
      std::operator<<((ostream *)*in_RDI,",");
    }
    fill(in_stack_ffffffffffffff70,(Fodder *)in_stack_ffffffffffffff68,false,false);
    in_stack_ffffffffffffff68 = (ostream *)*in_RDI;
    in_stack_ffffffffffffff70 = &local_70;
    unparse_id_abi_cxx11_((Identifier *)in_stack_ffffffffffffff68);
    std::operator<<(in_stack_ffffffffffffff68,(string *)in_stack_ffffffffffffff70);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_50->expr != (AST *)0x0) {
      fill(in_stack_ffffffffffffff70,(Fodder *)in_stack_ffffffffffffff68,false,false);
      std::operator<<((ostream *)*in_RDI,"=");
      unparse(in_stack_000005a0,in_stack_00000598,(bool)in_stack_00000597);
    }
    fill(in_stack_ffffffffffffff70,(Fodder *)in_stack_ffffffffffffff68,false,false);
    local_29 = 0;
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
    ::operator++(&local_40);
  }
  if ((local_19 & 1) != 0) {
    std::operator<<((ostream *)*in_RDI,",");
  }
  fill(in_stack_ffffffffffffff70,(Fodder *)in_stack_ffffffffffffff68,false,false);
  std::operator<<((ostream *)*in_RDI,")");
  return;
}

Assistant:

void unparseParams(const Fodder &fodder_l, const ArgParams &params, bool trailing_comma,
                       const Fodder &fodder_r)
    {
        fill(fodder_l, false, false);
        o << "(";
        bool first = true;
        for (const auto &param : params) {
            if (!first)
                o << ",";
            fill(param.idFodder, !first, true);
            o << unparse_id(param.id);
            if (param.expr != nullptr) {
                // default arg, no spacing: x=e
                fill(param.eqFodder, false, false);
                o << "=";
                unparse(param.expr, false);
            }
            fill(param.commaFodder, false, false);
            first = false;
        }
        if (trailing_comma)
            o << ",";
        fill(fodder_r, false, false);
        o << ")";
    }